

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O2

void av1_pick_cdef_from_qp(AV1_COMMON *cm,int skip_cdef,int is_screen_content)

{
  ushort *puVar1;
  aom_bit_depth_t bit_depth;
  undefined1 auVar2 [16];
  int16_t iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  MB_MODE_INFO **ppMVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  int iVar15;
  undefined1 auVar14 [16];
  float fVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar20;
  undefined1 auVar19 [16];
  uint local_68;
  uint uStack_64;
  
  bit_depth = cm->seq_params->bit_depth;
  iVar3 = av1_ac_quant_QTX((cm->quant_params).base_qindex,0,bit_depth);
  iVar4 = (int)iVar3 >> ((char)bit_depth - 8U & 0x1f);
  (cm->cdef_info).cdef_bits = (uint)(skip_cdef != 0);
  (cm->cdef_info).nb_cdef_strengths = (skip_cdef != 0) + 1;
  (cm->cdef_info).cdef_damping = ((cm->quant_params).base_qindex >> 6) + 3;
  if (is_screen_content == 0) {
    fVar10 = (float)iVar4;
    fVar16 = (float)(iVar4 * iVar4);
    if (((cm->current_frame).frame_type & 0xfd) == 0) {
      fVar11 = roundf(fVar16 * 2.9167343e-06 + fVar10 * 0.0027798624 + 0.0079405);
      fVar12 = roundf(fVar16 * 3.3731974e-06 + fVar10 * 0.008070594 + 0.0187634);
      uVar18 = -(uint)((int)fVar11 < 3);
      uVar20 = -(uint)((int)fVar12 < 0xf);
      local_68 = ~uVar18 & 3 | (int)fVar11 & uVar18;
      uStack_64 = ~uVar20 & 0xf | (int)fVar12 & uVar20;
      local_68 = -(uint)(0 < (int)local_68) & local_68;
      uStack_64 = -(uint)(0 < (int)uStack_64) & uStack_64;
      fVar11 = roundf(fVar16 * -1.30790995e-05 + fVar10 * 0.012892405 + -0.00748388);
      iVar4 = 0xf;
      if ((int)fVar11 < 0xf) {
        iVar4 = (int)fVar11;
      }
      iVar5 = 0;
      if (0 < iVar4) {
        iVar5 = iVar4;
      }
      fVar10 = fVar16 * 3.2651783e-06 + fVar10 * 0.00035520183 + 0.00228092;
    }
    else {
      fVar11 = roundf(fVar16 * -5.7629734e-07 + fVar10 * 0.0013993345 + 0.03831067);
      fVar12 = roundf(fVar16 * -2.3593946e-06 + fVar10 * 0.0068615186 + 0.02709886);
      uVar18 = -(uint)((int)fVar11 < 3);
      uVar20 = -(uint)((int)fVar12 < 0xf);
      local_68 = ~uVar18 & 3 | (int)fVar11 & uVar18;
      uStack_64 = ~uVar20 & 0xf | (int)fVar12 & uVar20;
      local_68 = -(uint)(0 < (int)local_68) & local_68;
      uStack_64 = -(uint)(0 < (int)uStack_64) & uStack_64;
      fVar11 = roundf(fVar16 * -7.095069e-07 + fVar10 * 0.0034628846 + 0.00887099);
      iVar4 = 0xf;
      if ((int)fVar11 < 0xf) {
        iVar4 = (int)fVar11;
      }
      iVar5 = 0;
      if (0 < iVar4) {
        iVar5 = iVar4;
      }
      fVar10 = fVar16 * 2.3874085e-07 + fVar10 * 0.00028223585 + 0.05576307;
    }
    fVar10 = roundf(fVar10);
    uVar17 = CONCAT44(uStack_64,local_68);
    iVar4 = (int)fVar10;
  }
  else {
    dVar13 = (double)iVar4;
    iVar5 = (int)(dVar13 * -6.79500136e-06 * dVar13 + dVar13 * 0.0102695586 + 0.136126802);
    iVar4 = (int)(dVar13 * -9.99613695e-08 * dVar13 + dVar13 * -1.79361339e-05 + 1.17022324);
    iVar9 = (int)(dVar13 * 0.0065895783 + dVar13 * -7.79934857e-06 * dVar13 + 0.881045025);
    iVar15 = (int)(dVar13 * 0.00610391455 + dVar13 * 5.88217781e-06 * dVar13 + 0.0995043102);
    auVar2 = ZEXT816(0xf00000003);
    auVar19._0_8_ = CONCAT44(-(uint)(iVar15 < auVar2._4_4_),-(uint)(iVar9 < auVar2._0_4_));
    auVar19._8_8_ = 0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = CONCAT44(iVar15,iVar9) & auVar19._0_8_;
    auVar14 = ~auVar19 & auVar2 | auVar14;
    iVar9 = 0xf;
    if (iVar5 < 0xf) {
      iVar9 = iVar5;
    }
    uVar17 = CONCAT44(-(uint)(0 < auVar14._4_4_),-(uint)(0 < auVar14._0_4_)) & auVar14._0_8_;
    iVar5 = 0;
    if (0 < iVar9) {
      iVar5 = iVar9;
    }
  }
  iVar9 = 3;
  if (iVar4 < 3) {
    iVar9 = iVar4;
  }
  iVar4 = 0;
  if (0 < iVar9) {
    iVar4 = iVar9;
  }
  (cm->cdef_info).cdef_strengths[0] = (int)uVar17 + (int)(uVar17 >> 0x20) * 4;
  (cm->cdef_info).cdef_uv_strengths[0] = iVar4 + iVar5 * 4;
  if (skip_cdef == 0) {
    ppMVar8 = (cm->mi_params).mi_grid_base;
    if (ppMVar8 != (MB_MODE_INFO **)0x0) {
      uVar17 = (long)((cm->mi_params).mi_cols + 0xf) / 0x10;
      uVar6 = uVar17 & 0xffffffff;
      iVar4 = ((cm->mi_params).mi_rows + 0xf) / 0x10;
      iVar5 = 0;
      if ((int)uVar17 < 1) {
        uVar6 = 0;
      }
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      for (; iVar5 != iVar4; iVar5 = iVar5 + 1) {
        for (lVar7 = 0; uVar6 * 0x80 != lVar7; lVar7 = lVar7 + 0x80) {
          puVar1 = (ushort *)(*(long *)((long)ppMVar8 + lVar7) + 0xa7);
          *puVar1 = *puVar1 & 0x87ff;
        }
        ppMVar8 = ppMVar8 + (long)(cm->mi_params).mi_stride * 0x10;
      }
    }
  }
  else {
    (cm->cdef_info).cdef_strengths[1] = 0;
    (cm->cdef_info).cdef_uv_strengths[1] = 0;
  }
  return;
}

Assistant:

void av1_pick_cdef_from_qp(AV1_COMMON *const cm, int skip_cdef,
                           int is_screen_content) {
  const int bd = cm->seq_params->bit_depth;
  const int q =
      av1_ac_quant_QTX(cm->quant_params.base_qindex, 0, bd) >> (bd - 8);
  CdefInfo *const cdef_info = &cm->cdef_info;
  // Check the speed feature to avoid extra signaling.
  if (skip_cdef) {
    cdef_info->cdef_bits = 1;
    cdef_info->nb_cdef_strengths = 2;
  } else {
    cdef_info->cdef_bits = 0;
    cdef_info->nb_cdef_strengths = 1;
  }
  cdef_info->cdef_damping = 3 + (cm->quant_params.base_qindex >> 6);

  int predicted_y_f1 = 0;
  int predicted_y_f2 = 0;
  int predicted_uv_f1 = 0;
  int predicted_uv_f2 = 0;
  if (is_screen_content) {
    predicted_y_f1 =
        (int)(5.88217781e-06 * q * q + 6.10391455e-03 * q + 9.95043102e-02);
    predicted_y_f2 =
        (int)(-7.79934857e-06 * q * q + 6.58957830e-03 * q + 8.81045025e-01);
    predicted_uv_f1 =
        (int)(-6.79500136e-06 * q * q + 1.02695586e-02 * q + 1.36126802e-01);
    predicted_uv_f2 =
        (int)(-9.99613695e-08 * q * q - 1.79361339e-05 * q + 1.17022324e+0);
    predicted_y_f1 = clamp(predicted_y_f1, 0, 15);
    predicted_y_f2 = clamp(predicted_y_f2, 0, 3);
    predicted_uv_f1 = clamp(predicted_uv_f1, 0, 15);
    predicted_uv_f2 = clamp(predicted_uv_f2, 0, 3);
  } else {
    if (!frame_is_intra_only(cm)) {
      predicted_y_f1 = clamp((int)roundf(q * q * -0.0000023593946f +
                                         q * 0.0068615186f + 0.02709886f),
                             0, 15);
      predicted_y_f2 = clamp((int)roundf(q * q * -0.00000057629734f +
                                         q * 0.0013993345f + 0.03831067f),
                             0, 3);
      predicted_uv_f1 = clamp((int)roundf(q * q * -0.0000007095069f +
                                          q * 0.0034628846f + 0.00887099f),
                              0, 15);
      predicted_uv_f2 = clamp((int)roundf(q * q * 0.00000023874085f +
                                          q * 0.00028223585f + 0.05576307f),
                              0, 3);
    } else {
      predicted_y_f1 = clamp(
          (int)roundf(q * q * 0.0000033731974f + q * 0.008070594f + 0.0187634f),
          0, 15);
      predicted_y_f2 = clamp((int)roundf(q * q * 0.0000029167343f +
                                         q * 0.0027798624f + 0.0079405f),
                             0, 3);
      predicted_uv_f1 = clamp((int)roundf(q * q * -0.0000130790995f +
                                          q * 0.012892405f - 0.00748388f),
                              0, 15);
      predicted_uv_f2 = clamp((int)roundf(q * q * 0.0000032651783f +
                                          q * 0.00035520183f + 0.00228092f),
                              0, 3);
    }
  }
  cdef_info->cdef_strengths[0] =
      predicted_y_f1 * CDEF_SEC_STRENGTHS + predicted_y_f2;
  cdef_info->cdef_uv_strengths[0] =
      predicted_uv_f1 * CDEF_SEC_STRENGTHS + predicted_uv_f2;

  // mbmi->cdef_strength is already set in the encoding stage. We don't need to
  // set it again here.
  if (skip_cdef) {
    cdef_info->cdef_strengths[1] = 0;
    cdef_info->cdef_uv_strengths[1] = 0;
    return;
  }

  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int nvfb = (mi_params->mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  const int nhfb = (mi_params->mi_cols + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  MB_MODE_INFO **mbmi = mi_params->mi_grid_base;
  // mbmi is NULL when real-time rate control library is used.
  if (!mbmi) return;
  for (int r = 0; r < nvfb; ++r) {
    for (int c = 0; c < nhfb; ++c) {
      MB_MODE_INFO *current_mbmi = mbmi[MI_SIZE_64X64 * c];
      current_mbmi->cdef_strength = 0;
    }
    mbmi += MI_SIZE_64X64 * mi_params->mi_stride;
  }
}